

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

uint64_t __thiscall
duckdb::ParquetReader::GetGroupSpan(ParquetReader *this,ParquetReaderScanState *state)

{
  _ColumnMetaData__isset _Var1;
  ParquetRowGroup *pPVar2;
  ulong uVar3;
  ColumnChunk *column_chunk;
  pointer pCVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pPVar2 = GetGroup(this,state);
  uVar3 = 0;
  uVar5 = 0xffffffffffffffff;
  for (pCVar4 = (pPVar2->columns).
                super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                .
                super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar4 != (pPVar2->columns).
                super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                .
                super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar4 = pCVar4 + 1) {
    _Var1 = (pCVar4->meta_data).__isset;
    uVar6 = 0xffffffffffffffff;
    if (((byte)_Var1 & 4) != 0) {
      uVar6 = (pCVar4->meta_data).dictionary_page_offset;
    }
    if ((((byte)_Var1 & 2) != 0) && (uVar7 = (pCVar4->meta_data).index_page_offset, uVar7 <= uVar6))
    {
      uVar6 = uVar7;
    }
    uVar7 = (pCVar4->meta_data).data_page_offset;
    if (uVar6 < uVar7) {
      uVar7 = uVar6;
    }
    if (uVar7 < uVar5) {
      uVar5 = uVar7;
    }
    uVar7 = uVar7 + (pCVar4->meta_data).total_compressed_size;
    if (uVar3 <= uVar7) {
      uVar3 = uVar7;
    }
  }
  return uVar3 - uVar5;
}

Assistant:

uint64_t ParquetReader::GetGroupSpan(ParquetReaderScanState &state) {
	auto &group = GetGroup(state);
	idx_t min_offset = NumericLimits<idx_t>::Maximum();
	idx_t max_offset = NumericLimits<idx_t>::Minimum();

	for (auto &column_chunk : group.columns) {

		// Set the min offset
		idx_t current_min_offset = NumericLimits<idx_t>::Maximum();
		if (column_chunk.meta_data.__isset.dictionary_page_offset) {
			current_min_offset = MinValue<idx_t>(current_min_offset, column_chunk.meta_data.dictionary_page_offset);
		}
		if (column_chunk.meta_data.__isset.index_page_offset) {
			current_min_offset = MinValue<idx_t>(current_min_offset, column_chunk.meta_data.index_page_offset);
		}
		current_min_offset = MinValue<idx_t>(current_min_offset, column_chunk.meta_data.data_page_offset);
		min_offset = MinValue<idx_t>(current_min_offset, min_offset);
		max_offset = MaxValue<idx_t>(max_offset, column_chunk.meta_data.total_compressed_size + current_min_offset);
	}

	return max_offset - min_offset;
}